

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O1

void __thiscall slack::_detail::Slacking::~Slacking(Slacking *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->hook).Id._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->hook).Id.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->hook).icon_emoji._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->hook).icon_emoji.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->hook).username._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->hook).username.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->hook).channel._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->hook).channel.field_2) {
    operator_delete(pcVar1);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&(this->chat).attachments);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::json_value::destroy
            ((json_value *)&(this->chat).attachments.m_value.boolean,(this->chat).attachments.m_type
            );
  pcVar1 = (this->chat).parse._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->chat).parse.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->chat).icon_emoji._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->chat).icon_emoji.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->chat).icon_url._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->chat).icon_url.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->chat).username._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->chat).username.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->chat).channel._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->chat).channel.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->token_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->token_).field_2) {
    operator_delete(pcVar1);
  }
  Session::~Session(&this->session_);
  pcVar1 = (this->base_url)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->base_url).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Slacking() = delete;